

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefile(cmGlobalUnixMakefileGenerator3 *this)

{
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar1;
  pointer pcVar2;
  pointer ppcVar3;
  cmake *this_00;
  cmLocalGenerator *pcVar4;
  long lVar5;
  bool bVar6;
  string *psVar7;
  ostream *poVar8;
  ulong uVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  cmGlobalUnixMakefileGenerator3 *this_01;
  string *f;
  pointer pbVar10;
  pointer pbVar11;
  pointer ppcVar12;
  string tmpStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lfiles;
  string check;
  string currentBinDir;
  string binDir;
  string makefileName;
  string cmakefileName;
  cmGeneratedFileStream cmakefileStream;
  undefined1 local_378 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  string local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_280;
  undefined1 local_278 [32];
  byte abStack_258 [552];
  
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_278,"CMAKE_SUPPRESS_REGENERATION","");
  bVar6 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)local_278);
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if (!bVar6) {
    psVar7 = cmake::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    pcVar2 = (psVar7->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c0,pcVar2,pcVar2 + psVar7->_M_string_length);
    std::__cxx11::string::append((char *)&local_2c0);
    std::__cxx11::string::append((char *)&local_2c0);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_278,&local_2c0,false,None);
    if ((abStack_258[*(long *)(local_278._0_8_ + -0x18)] & 5) == 0) {
      psVar7 = cmake::GetHomeOutputDirectory_abi_cxx11_
                         ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      pcVar2 = (psVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e0,pcVar2,pcVar2 + psVar7->_M_string_length);
      std::__cxx11::string::append((char *)&local_2e0);
      cmLocalUnixMakefileGenerator3::WriteDisclaimer
                ((cmLocalUnixMakefileGenerator3 *)
                 *(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,(ostream *)local_278);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"# The generator used is:\n",0x19);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"set(CMAKE_DEPENDS_GENERATOR \"",0x1d);
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[3])
                (&local_320);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_278,(char *)local_320._M_allocated_capacity,
                          local_320._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\")\n\n",4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_allocated_capacity != &local_310) {
        operator_delete((void *)local_320._M_allocated_capacity,local_310._M_allocated_capacity + 1)
        ;
      }
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppcVar12 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppcVar3 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppcVar12 != ppcVar3) {
        do {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_358
                     ,local_358.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
                     ((*ppcVar12)->Makefile->ListFiles).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     ((*ppcVar12)->Makefile->ListFiles).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          ppcVar12 = ppcVar12 + 1;
        } while (ppcVar12 != ppcVar3);
      }
      this_00 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
      bVar6 = cmake::DoWriteGlobVerifyTarget(this_00);
      if (bVar6) {
        psVar7 = cmake::GetGlobVerifyScript_abi_cxx11_(this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_358,psVar7);
        psVar7 = cmake::GetGlobVerifyStamp_abi_cxx11_(this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_358,psVar7);
      }
      pbVar10 = local_358.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar11 = local_358.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar9 = (long)local_358.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_358.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar5 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
                  (local_358.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_358.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
                  (pbVar11,pbVar10);
      }
      __first = std::
                __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                          (local_358.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_358.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(&local_358,(iterator)__first._M_current,
                 (iterator)
                 local_358.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      pvVar1 = &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators;
      pcVar4 = *(pvVar1->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar4);
      local_320._M_allocated_capacity = (size_type)&local_310;
      pcVar2 = (psVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_320,pcVar2,pcVar2 + psVar7->_M_string_length);
      local_280 = pvVar1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,
                 "# The top level Makefile was generated from the following files:\n",0x41);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"set(CMAKE_MAKEFILE_DEPENDS\n",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"  \"CMakeCache.txt\"\n",0x13);
      pbVar11 = local_358.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar10 = local_358.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  \"",3);
          cmLocalGenerator::MaybeConvertToRelativePath
                    (&local_340,pcVar4,(string *)&local_320,pbVar10);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_278,local_340._M_dataplus._M_p,
                              local_340._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) {
            operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
          }
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 != pbVar11);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  )\n\n",5);
      psVar7 = cmake::GetHomeOutputDirectory_abi_cxx11_
                         ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      pcVar2 = (psVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_340,pcVar2,pcVar2 + psVar7->_M_string_length);
      std::__cxx11::string::append((char *)&local_340);
      std::__cxx11::string::append((char *)&local_340);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"# The corresponding makefile is:\n",0x21);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"set(CMAKE_MAKEFILE_OUTPUTS\n",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  \"",3);
      cmLocalGenerator::MaybeConvertToRelativePath
                ((string *)&local_300,pcVar4,(string *)&local_320,&local_2e0);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_278,(char *)local_300._M_allocated_capacity,
                          local_300._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  \"",3);
      cmLocalGenerator::MaybeConvertToRelativePath
                ((string *)local_378,pcVar4,(string *)&local_320,&local_340);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(char *)local_378._0_8_,local_378._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
      if ((cmGlobalUnixMakefileGenerator3 *)local_378._0_8_ !=
          (cmGlobalUnixMakefileGenerator3 *)(local_378 + 0x10)) {
        operator_delete((void *)local_378._0_8_,CONCAT71(local_378._17_7_,local_378[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_allocated_capacity != &local_2f0) {
        operator_delete((void *)local_300._M_allocated_capacity,local_2f0._M_allocated_capacity + 1)
        ;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  )\n\n",5);
      psVar7 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar4);
      pcVar2 = (psVar7->_M_dataplus)._M_p;
      local_300._M_allocated_capacity = (size_type)&local_2f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_300,pcVar2,pcVar2 + psVar7->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"# Byproducts of CMake generate step:\n",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"set(CMAKE_MAKEFILE_PRODUCTS\n",0x1c);
      pbVar11 = (pcVar4->Makefile->OutputFiles).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar10 = (pcVar4->Makefile->OutputFiles).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar11 != pbVar10) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  \"",3);
          cmLocalGenerator::MaybeConvertToRelativePath
                    ((string *)local_378,pcVar4,(string *)&local_300,pbVar11);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_278,(char *)local_378._0_8_,local_378._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
          if ((cmGlobalUnixMakefileGenerator3 *)local_378._0_8_ !=
              (cmGlobalUnixMakefileGenerator3 *)(local_378 + 0x10)) {
            operator_delete((void *)local_378._0_8_,CONCAT71(local_378._17_7_,local_378[0x10]) + 1);
          }
          pbVar11 = pbVar11 + 1;
        } while (pbVar11 != pbVar10);
      }
      local_378._0_8_ = local_378 + 0x10;
      local_378._8_8_ = 0;
      local_378[0x10] = '\0';
      ppcVar12 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppcVar3 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppcVar12 != ppcVar3) {
        do {
          pcVar4 = *ppcVar12;
          cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar4);
          std::__cxx11::string::_M_assign((string *)local_378);
          std::__cxx11::string::append((char *)local_378);
          std::__cxx11::string::append((char *)local_378);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  \"",3);
          cmLocalGenerator::MaybeConvertToRelativePath
                    (&local_2a0,pcVar4,(string *)&local_300,(string *)local_378);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_278,local_2a0._M_dataplus._M_p,
                              local_2a0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
          }
          ppcVar12 = ppcVar12 + 1;
        } while (ppcVar12 != ppcVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  )\n\n",5);
      this_01 = (cmGlobalUnixMakefileGenerator3 *)local_378._0_8_;
      if ((cmGlobalUnixMakefileGenerator3 *)local_378._0_8_ !=
          (cmGlobalUnixMakefileGenerator3 *)(local_378 + 0x10)) {
        operator_delete((void *)local_378._0_8_,CONCAT71(local_378._17_7_,local_378[0x10]) + 1);
      }
      WriteMainCMakefileLanguageRules(this_01,(cmGeneratedFileStream *)local_278,local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_allocated_capacity != &local_2f0) {
        operator_delete((void *)local_300._M_allocated_capacity,local_2f0._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_allocated_capacity != &local_310) {
        operator_delete((void *)local_320._M_allocated_capacity,local_310._M_allocated_capacity + 1)
        ;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainCMakefile()
{
  if (this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    return;
  }

  // Open the output file.  This should not be copy-if-different
  // because the check-build-system step compares the makefile time to
  // see if the build system must be regenerated.
  std::string cmakefileName =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  cmakefileName += "/CMakeFiles";
  cmakefileName += "/Makefile.cmake";
  cmGeneratedFileStream cmakefileStream(cmakefileName);
  if (!cmakefileStream) {
    return;
  }

  std::string makefileName =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  makefileName += "/Makefile";

  // get a local generator for some useful methods
  cmLocalUnixMakefileGenerator3* lg =
    static_cast<cmLocalUnixMakefileGenerator3*>(this->LocalGenerators[0]);

  // Write the do not edit header.
  lg->WriteDisclaimer(cmakefileStream);

  // Save the generator name
  cmakefileStream << "# The generator used is:\n"
                  << "set(CMAKE_DEPENDS_GENERATOR \"" << this->GetName()
                  << "\")\n\n";

  // for each cmMakefile get its list of dependencies
  std::vector<std::string> lfiles;
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    // Get the list of files contributing to this generation step.
    cmAppend(lfiles, localGen->GetMakefile()->GetListFiles());
  }

  cmake* cm = this->GetCMakeInstance();
  if (cm->DoWriteGlobVerifyTarget()) {
    lfiles.push_back(cm->GetGlobVerifyScript());
    lfiles.push_back(cm->GetGlobVerifyStamp());
  }

  // Sort the list and remove duplicates.
  std::sort(lfiles.begin(), lfiles.end(), std::less<std::string>());
#if !defined(__VMS) // The Compaq STL on VMS crashes, so accept duplicates.
  std::vector<std::string>::iterator new_end =
    std::unique(lfiles.begin(), lfiles.end());
  lfiles.erase(new_end, lfiles.end());
#endif

  // reset lg to the first makefile
  lg = static_cast<cmLocalUnixMakefileGenerator3*>(this->LocalGenerators[0]);

  std::string currentBinDir = lg->GetCurrentBinaryDirectory();
  // Save the list to the cmake file.
  cmakefileStream
    << "# The top level Makefile was generated from the following files:\n"
    << "set(CMAKE_MAKEFILE_DEPENDS\n"
    << "  \"CMakeCache.txt\"\n";
  for (std::string const& f : lfiles) {
    cmakefileStream << "  \""
                    << lg->MaybeConvertToRelativePath(currentBinDir, f)
                    << "\"\n";
  }
  cmakefileStream << "  )\n\n";

  // Build the path to the cache check file.
  std::string check = this->GetCMakeInstance()->GetHomeOutputDirectory();
  check += "/CMakeFiles";
  check += "/cmake.check_cache";

  // Set the corresponding makefile in the cmake file.
  cmakefileStream << "# The corresponding makefile is:\n"
                  << "set(CMAKE_MAKEFILE_OUTPUTS\n"
                  << "  \""
                  << lg->MaybeConvertToRelativePath(currentBinDir,
                                                    makefileName)
                  << "\"\n"
                  << "  \""
                  << lg->MaybeConvertToRelativePath(currentBinDir, check)
                  << "\"\n";
  cmakefileStream << "  )\n\n";

  const std::string binDir = lg->GetBinaryDirectory();

  // CMake must rerun if a byproduct is missing.
  {
    cmakefileStream << "# Byproducts of CMake generate step:\n"
                    << "set(CMAKE_MAKEFILE_PRODUCTS\n";
    for (std::string const& outfile : lg->GetMakefile()->GetOutputFiles()) {
      cmakefileStream << "  \""
                      << lg->MaybeConvertToRelativePath(binDir, outfile)
                      << "\"\n";
    }

    // add in all the directory information files
    std::string tmpStr;
    for (cmLocalGenerator* localGen : this->LocalGenerators) {
      lg = static_cast<cmLocalUnixMakefileGenerator3*>(localGen);
      tmpStr = lg->GetCurrentBinaryDirectory();
      tmpStr += "/CMakeFiles";
      tmpStr += "/CMakeDirectoryInformation.cmake";
      cmakefileStream << "  \""
                      << lg->MaybeConvertToRelativePath(binDir, tmpStr)
                      << "\"\n";
    }
    cmakefileStream << "  )\n\n";
  }

  this->WriteMainCMakefileLanguageRules(cmakefileStream,
                                        this->LocalGenerators);
}